

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_gd2.c
# Opt level: O3

gdImagePtr gdImageCreateFromGd2Ctx(gdIOCtxPtr in)

{
  byte *pbVar1;
  int iVar2;
  int iVar3;
  gdImagePtr im;
  char *chunkBuf;
  long lVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  int iVar10;
  long lVar11;
  size_t nmemb;
  char *compBuf;
  size_t nmemb_00;
  int fmt;
  int cs;
  int ncy;
  int ncx;
  gdIOCtxPtr local_90;
  t_chunk_info *chunkIdx;
  char *local_80;
  int local_78;
  int local_74;
  int ch;
  int vers;
  int sy;
  int sx;
  t_chunk_info *local_60;
  long local_58;
  long local_50;
  size_t local_48;
  long local_40;
  uLongf chunkLen;
  
  chunkIdx = (t_chunk_info *)0x0;
  local_90 = in;
  iVar2 = _gd2GetHeader(in,&sx,&sy,&cs,&vers,&fmt,&ncx,&ncy,&chunkIdx);
  if (iVar2 != 0) {
    if (fmt - 3U < 2) {
      im = gdImageCreateTrueColor(sx,sy);
    }
    else {
      im = gdImageCreate(sx,sy);
    }
    if (im != (gdImagePtr)0x0) {
      iVar2 = _gdGetColors(local_90,im,(uint)(vers == 2));
      if (iVar2 == 0) {
        gdImageDestroy(im);
      }
      else {
        if (fmt != 4) {
          chunkBuf = (char *)0x0;
          nmemb_00 = 0;
          compBuf = (char *)0x0;
          if (fmt != 2) goto LAB_00115c31;
        }
        if (ncx * ncy < 1) {
          nmemb = 1;
        }
        else {
          uVar8 = 0;
          iVar2 = 0;
          do {
            if (iVar2 < chunkIdx[uVar8].size) {
              iVar2 = chunkIdx[uVar8].size;
            }
            uVar8 = uVar8 + 1;
          } while ((uint)(ncx * ncy) != uVar8);
          nmemb = (size_t)(iVar2 + 1);
        }
        nmemb_00 = (size_t)((cs << (im->trueColor != 0) * '\x02') * cs);
        chunkBuf = (char *)gdCalloc(nmemb_00,1);
        if (chunkBuf == (char *)0x0) {
          gdImageDestroy(im);
        }
        else {
          compBuf = (char *)gdCalloc(nmemb,1);
          if (compBuf != (char *)0x0) {
LAB_00115c31:
            local_60 = chunkIdx;
            if (0 < ncy) {
              iVar3 = 0;
              uVar8 = 0;
              lVar9 = 0;
              iVar2 = ncy;
              iVar6 = ncx;
              local_80 = compBuf;
              local_48 = nmemb_00;
              do {
                if (0 < iVar6) {
                  lVar9 = (long)(int)lVar9;
                  iVar10 = 0;
                  local_74 = iVar3;
                  do {
                    iVar6 = cs * local_74;
                    iVar2 = cs + iVar6;
                    if (im->sy <= cs + iVar6) {
                      iVar2 = im->sy;
                    }
                    local_58 = lVar9;
                    if ((fmt == 4) || (fmt == 2)) {
                      chunkLen = local_48;
                      iVar3 = _gd2ReadChunk(local_60[lVar9].offset,compBuf,local_60[lVar9].size,
                                            chunkBuf,&chunkLen,local_90);
                      uVar8 = 0;
                      if (iVar3 == 0) {
LAB_00115e73:
                        gdImageDestroy(im);
                        if (chunkBuf == (char *)0x0) goto LAB_00115e9f;
                        goto LAB_00115e97;
                      }
                    }
                    lVar9 = local_58;
                    if (iVar6 < iVar2) {
                      lVar7 = (long)iVar6;
                      lVar11 = (long)iVar2;
                      local_78 = iVar10;
                      local_50 = lVar11;
                      do {
                        iVar6 = cs * iVar10;
                        iVar2 = cs + iVar6;
                        if (im->sx <= cs + iVar6) {
                          iVar2 = im->sx;
                        }
                        if ((fmt == 4) || (fmt == 2)) {
                          if (iVar6 < iVar2) {
                            lVar4 = (long)iVar6;
                            do {
                              iVar6 = (int)uVar8;
                              lVar5 = (long)iVar6;
                              uVar8 = lVar5 + 1;
                              if (im->trueColor == 0) {
                                im->pixels[lVar7][lVar4] = chunkBuf[lVar5];
                              }
                              else {
                                pbVar1 = (byte *)(chunkBuf + uVar8);
                                uVar8 = (ulong)(iVar6 + 4);
                                im->tpixels[lVar7][lVar4] =
                                     (uint)(byte)chunkBuf[lVar5 + 3] |
                                     (uint)(byte)chunkBuf[lVar5 + 2] << 8 |
                                     (uint)*pbVar1 << 0x10 | (uint)(byte)chunkBuf[lVar5] << 0x18;
                              }
                              lVar4 = lVar4 + 1;
                            } while (lVar4 < iVar2);
                          }
                        }
                        else if (iVar6 < iVar2) {
                          lVar4 = (long)iVar6;
                          local_40 = (long)iVar2;
                          lVar5 = (long)iVar6 << 2;
                          do {
                            if (im->trueColor == 0) {
                              iVar2 = gdGetByte(&ch,local_90);
                              if (iVar2 == 0) goto LAB_00115e60;
                              im->pixels[lVar7][lVar4] = (uchar)ch;
                            }
                            else {
                              iVar2 = gdGetInt((int *)((long)im->tpixels[lVar7] + lVar5),local_90);
                              if (iVar2 == 0) {
LAB_00115e60:
                                gd_error("gd2: EOF while reading\n");
                                compBuf = local_80;
                                goto LAB_00115e73;
                              }
                            }
                            lVar4 = lVar4 + 1;
                            lVar5 = lVar5 + 4;
                            lVar9 = local_58;
                            lVar11 = local_50;
                            compBuf = local_80;
                            iVar10 = local_78;
                          } while (lVar4 < local_40);
                        }
                        lVar7 = lVar7 + 1;
                      } while (lVar7 < lVar11);
                    }
                    lVar9 = lVar9 + 1;
                    iVar10 = iVar10 + 1;
                    iVar2 = ncy;
                    iVar6 = ncx;
                    iVar3 = local_74;
                  } while (iVar10 < ncx);
                }
                iVar3 = iVar3 + 1;
              } while (iVar3 < iVar2);
            }
            gdFree(chunkBuf);
            gdFree(compBuf);
            gdFree(local_60);
            return im;
          }
          gdImageDestroy(im);
          compBuf = (char *)0x0;
LAB_00115e97:
          gdFree(chunkBuf);
LAB_00115e9f:
          if (compBuf != (char *)0x0) {
            gdFree(compBuf);
          }
        }
        if (chunkIdx == (t_chunk_info *)0x0) {
          return (gdImagePtr)0x0;
        }
      }
    }
    gdFree(chunkIdx);
  }
  return (gdImagePtr)0x0;
}

Assistant:

BGD_DECLARE(gdImagePtr) gdImageCreateFromGd2Ctx (gdIOCtxPtr in)
{
	int sx, sy;
	int i;
	int ncx, ncy, nc, cs, cx, cy;
	int x, y, ylo, yhi, xlo, xhi;
	int vers, fmt;
	t_chunk_info *chunkIdx = NULL;	/* So we can gdFree it with impunity. */
	unsigned char *chunkBuf = NULL;	/* So we can gdFree it with impunity. */
	int chunkNum = 0;
	int chunkMax = 0;
	uLongf chunkLen;
	int chunkPos = 0;
	int compMax = 0;
	int bytesPerPixel;
	char *compBuf = NULL;		/* So we can gdFree it with impunity. */

	gdImagePtr im;

	/* Get the header */
	im =
	    _gd2CreateFromFile (in, &sx, &sy, &cs, &vers, &fmt, &ncx, &ncy,
	                        &chunkIdx);
	if (im == NULL) {
		/* No need to free chunkIdx as _gd2CreateFromFile does it for us. */
		return 0;
	}

	bytesPerPixel = im->trueColor ? 4 : 1;
	nc = ncx * ncy;

	if (gd2_compressed (fmt)) {
		/* Find the maximum compressed chunk size. */
		compMax = 0;
		for (i = 0; (i < nc); i++) {
			if (chunkIdx[i].size > compMax) {
				compMax = chunkIdx[i].size;
			};
		};
		compMax++;

		/* Allocate buffers */
		chunkMax = cs * bytesPerPixel * cs;
		chunkBuf = gdCalloc (chunkMax, 1);
		if (!chunkBuf) {
			goto fail;
		}
		compBuf = gdCalloc (compMax, 1);
		if (!compBuf) {
			goto fail;
		}

		GD2_DBG (printf ("Largest compressed chunk is %d bytes\n", compMax));
	};

	/*      if ( (ncx != sx / cs) || (ncy != sy / cs)) { */
	/*              goto fail2; */
	/*      }; */

	/* Read the data... */
	for (cy = 0; (cy < ncy); cy++) {
		for (cx = 0; (cx < ncx); cx++) {

			ylo = cy * cs;
			yhi = ylo + cs;
			if (yhi > im->sy) {
				yhi = im->sy;
			};

			GD2_DBG (printf
			         ("Processing Chunk %d (%d, %d), y from %d to %d\n",
			          chunkNum, cx, cy, ylo, yhi));

			if (gd2_compressed (fmt)) {

				chunkLen = chunkMax;

				if (!_gd2ReadChunk (chunkIdx[chunkNum].offset,
				                    compBuf,
				                    chunkIdx[chunkNum].size,
				                    (char *) chunkBuf, &chunkLen, in)) {
					GD2_DBG (printf ("Error reading comproessed chunk\n"));
					goto fail;
				};

				chunkPos = 0;
			};

			for (y = ylo; (y < yhi); y++) {

				xlo = cx * cs;
				xhi = xlo + cs;
				if (xhi > im->sx) {
					xhi = im->sx;
				};
				/*GD2_DBG(printf("y=%d: ",y)); */
				if (!gd2_compressed (fmt)) {
					for (x = xlo; x < xhi; x++) {

						if (im->trueColor) {
							if (!gdGetInt (&im->tpixels[y][x], in)) {
								gd_error("gd2: EOF while reading\n");
								goto fail;
							}
						} else {
							int ch;
							if (!gdGetByte (&ch, in)) {
								gd_error("gd2: EOF while reading\n");
								goto fail;
							}
							im->pixels[y][x] = ch;
						}
					}
				} else {
					for (x = xlo; x < xhi; x++) {
						if (im->trueColor) {
							/* 2.0.1: work around a gcc bug by being verbose.
							   TBB */
							int a = chunkBuf[chunkPos++] << 24;
							int r = chunkBuf[chunkPos++] << 16;
							int g = chunkBuf[chunkPos++] << 8;
							int b = chunkBuf[chunkPos++];
							/* 2.0.11: tpixels */
							im->tpixels[y][x] = a + r + g + b;
						} else {
							im->pixels[y][x] = chunkBuf[chunkPos++];
						}
					};
				};
				/*GD2_DBG(printf("\n")); */
			};
			chunkNum++;
		};
	};

	GD2_DBG (printf ("Freeing memory\n"));

	gdFree (chunkBuf);
	gdFree (compBuf);
	gdFree (chunkIdx);

	GD2_DBG (printf ("Done\n"));

	return im;

fail:
	gdImageDestroy (im);
	if (chunkBuf) {
		gdFree (chunkBuf);
	}
	if (compBuf) {
		gdFree (compBuf);
	}
	if (chunkIdx) {
		gdFree (chunkIdx);
	}
	return 0;
}